

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void __thiscall embree::ISPCGridMesh::~ISPCGridMesh(ISPCGridMesh *this)

{
  ulong uVar1;
  
  if (this->positions != (Vec3fa **)0x0) {
    for (uVar1 = 0; uVar1 < this->numTimeSteps; uVar1 = uVar1 + 1) {
      alignedUSMFree(this->positions[uVar1]);
    }
    alignedUSMFree(this->positions);
  }
  alignedUSMFree(this->grids);
  ISPCGeometry::~ISPCGeometry(&this->geom);
  return;
}

Assistant:

ISPCGridMesh::~ISPCGridMesh ()
  {
    if (positions) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(positions[i]);
      alignedUSMFree(positions);
    }

    alignedUSMFree(grids);
  }